

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::IsTrue
          (cmConditionEvaluator *this,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args,
          string *errorString,MessageType *status)

{
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  __first;
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  __last;
  code *pcVar1;
  size_t sVar2;
  char cVar3;
  bool bVar4;
  code *pcVar5;
  long lVar6;
  long *plVar7;
  cmArgumentList newArgs;
  code *local_80;
  long local_78;
  code *pcStack_70;
  undefined8 local_68;
  code *pcStack_60;
  undefined8 local_58;
  code *pcStack_50;
  undefined8 local_48;
  code *pcStack_40;
  undefined8 local_38;
  
  errorString->_M_string_length = 0;
  *(errorString->_M_dataplus)._M_p = '\0';
  __first._M_current =
       (args->
       super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (args->
       super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current == __last._M_current) {
    bVar4 = false;
  }
  else {
    std::__cxx11::list<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
    list<__gnu_cxx::__normal_iterator<cmExpandedCommandArgument_const*,std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>>,void>
              ((list<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)&newArgs
               ,__first,__last,(allocator_type *)&local_80);
    local_78 = 0;
    local_68 = 0;
    local_58 = 0;
    local_48 = 0;
    local_38 = 0;
    local_80 = HandleLevel0;
    pcStack_70 = HandleLevel1;
    pcStack_60 = HandleLevel2;
    pcStack_50 = HandleLevel3;
    pcStack_40 = HandleLevel4;
    for (lVar6 = 0; lVar6 != 0x50; lVar6 = lVar6 + 0x10) {
      pcVar1 = *(code **)((long)&local_80 + lVar6);
      plVar7 = (long *)((long)&this->Makefile + *(long *)((long)&local_78 + lVar6));
      do {
        sVar2 = newArgs.
                super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
                super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl._M_node._M_size;
        pcVar5 = pcVar1;
        if (((ulong)pcVar1 & 1) != 0) {
          pcVar5 = *(code **)(pcVar1 + *plVar7 + -1);
        }
        cVar3 = (*pcVar5)(plVar7,&newArgs,errorString,status);
        if (cVar3 == '\0') goto LAB_003cefde;
      } while (newArgs.
               super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
               super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
               ._M_impl._M_node._M_size < sVar2);
    }
    if (newArgs.super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
        _M_impl._M_node._M_size == 1) {
      bVar4 = GetBooleanValueWithAutoDereference
                        (this,(cmExpandedCommandArgument *)
                              (newArgs.
                               super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                               .
                               super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                               ._M_impl._M_node.super__List_node_base._M_next + 1),errorString,
                         status,true);
    }
    else {
      std::__cxx11::string::assign((char *)errorString);
      *status = FATAL_ERROR;
LAB_003cefde:
      bVar4 = false;
    }
    std::__cxx11::_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
    ::_M_clear((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
               &newArgs);
  }
  return bVar4;
}

Assistant:

bool cmConditionEvaluator::IsTrue(
  const std::vector<cmExpandedCommandArgument>& args, std::string& errorString,
  MessageType& status)
{
  errorString.clear();

  // handle empty invocation
  if (args.empty()) {
    return false;
  }

  // store the reduced args in this vector
  cmArgumentList newArgs(args.begin(), args.end());

  // now loop through the arguments and see if we can reduce any of them
  // we do this multiple times. Once for each level of precedence
  // parens
  using handlerFn_t = bool (cmConditionEvaluator::*)(
    cmArgumentList&, std::string&, MessageType&);
  const std::array<handlerFn_t, 5> handlers = { {
    &cmConditionEvaluator::HandleLevel0, // parenthesis
    &cmConditionEvaluator::HandleLevel1, // predicates
    &cmConditionEvaluator::HandleLevel2, // binary ops
    &cmConditionEvaluator::HandleLevel3, // NOT
    &cmConditionEvaluator::HandleLevel4  // AND OR
  } };
  for (auto fn : handlers) {
    // Call the reducer 'till there is anything to reduce...
    // (i.e., if after an iteration the size becomes smaller)
    auto levelResult = true;
    for (auto beginSize = newArgs.size();
         (levelResult = (this->*fn)(newArgs, errorString, status)) &&
         newArgs.size() < beginSize;
         beginSize = newArgs.size()) {
    }

    if (!levelResult) {
      // NOTE `errorString` supposed to be set already
      return false;
    }
  }

  // now at the end there should only be one argument left
  if (newArgs.size() != 1) {
    errorString = "Unknown arguments specified";
    status = MessageType::FATAL_ERROR;
    return false;
  }

  return this->GetBooleanValueWithAutoDereference(newArgs.front(), errorString,
                                                  status, true);
}